

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall jessi_lazy_Test::~jessi_lazy_Test(jessi_lazy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(jessi, lazy) {
	std::string sentence = "   this           is a    sentence ";
	auto split_result = word_split(sentence, ' ');
	EXPECT_EQ(split_result.size(), 4);
	EXPECT_EQ(split_result[0], "this");
	EXPECT_EQ(split_result[1], "is");
	EXPECT_EQ(split_result[2], "a");
	EXPECT_EQ(split_result[3], "sentence");
}